

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuList.c
# Opt level: O2

void Fxu_ListMatrixAddCube(Fxu_Matrix *p,Fxu_Cube *pLink)

{
  int *piVar1;
  Fxu_Cube *pFVar2;
  
  if ((p->lCubes).pHead == (Fxu_Cube *)0x0) {
    (p->lCubes).pHead = pLink;
    (p->lCubes).pTail = pLink;
    pLink->pNext = (Fxu_Cube *)0x0;
    pFVar2 = (Fxu_Cube *)0x0;
  }
  else {
    pLink->pNext = (Fxu_Cube *)0x0;
    pFVar2 = (p->lCubes).pTail;
    pFVar2->pNext = pLink;
    (p->lCubes).pTail = pLink;
  }
  pLink->pPrev = pFVar2;
  piVar1 = &(p->lCubes).nItems;
  *piVar1 = *piVar1 + 1;
  return;
}

Assistant:

void Fxu_ListMatrixAddCube( Fxu_Matrix * p, Fxu_Cube * pLink )
{
    Fxu_ListCube * pList = &p->lCubes;
    if ( pList->pHead == NULL )
    {
        pList->pHead = pLink;
        pList->pTail = pLink;
        pLink->pPrev = NULL;
        pLink->pNext = NULL;
    }
    else
    {
        pLink->pNext = NULL;
        pList->pTail->pNext = pLink;
        pLink->pPrev = pList->pTail;
        pList->pTail = pLink;
    }
    pList->nItems++;
}